

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::_process_config_file(App *this)

{
  Option *this_00;
  size_t sVar1;
  ulong uVar2;
  char *file;
  element_type *this_01;
  FileError *pFVar3;
  string local_d8;
  FileError *anon_var_0;
  undefined1 local_90 [8];
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> values;
  path_type path_result;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> config_file;
  bool file_given;
  bool config_required;
  App *this_local;
  
  if (this->config_ptr_ != (Option *)0x0) {
    config_file.field_2._M_local_buf[0xf] =
         OptionBase<CLI::Option>::get_required(&this->config_ptr_->super_OptionBase<CLI::Option>);
    sVar1 = Option::count(this->config_ptr_);
    config_file.field_2._M_local_buf[0xe] = sVar1 != 0;
    Option::as<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               this->config_ptr_);
    uVar2 = ::std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      file = (char *)::std::__cxx11::string::c_str();
      values.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = detail::check_path(file);
      if ((path_type)
          values.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage == file) {
        this_01 = std::__shared_ptr_access<CLI::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<CLI::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->config_formatter_);
        Config::from_file((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)local_90,
                          this_01,(string *)local_38);
        _parse_config(this,(vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)local_90);
        if ((config_file.field_2._M_local_buf[0xe] & 1U) == 0) {
          this_00 = this->config_ptr_;
          ::std::__cxx11::string::string((string *)&anon_var_0,(string *)local_38);
          Option::add_result(this_00,(string *)&anon_var_0);
          ::std::__cxx11::string::~string((string *)&anon_var_0);
        }
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::~vector
                  ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)local_90);
      }
      else if (((config_file.field_2._M_local_buf[0xf] & 1U) != 0) ||
              ((config_file.field_2._M_local_buf[0xe] & 1U) != 0)) {
        pFVar3 = (FileError *)__cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string((string *)&local_d8,(string *)local_38);
        FileError::Missing(pFVar3,&local_d8);
        __cxa_throw(pFVar3,&FileError::typeinfo,FileError::~FileError);
      }
      values.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    else {
      if ((config_file.field_2._M_local_buf[0xf] & 1U) != 0) {
        pFVar3 = (FileError *)__cxa_allocate_exception(0x38);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"no specified config file",&local_59);
        FileError::Missing(pFVar3,&local_58);
        __cxa_throw(pFVar3,&FileError::typeinfo,FileError::~FileError);
      }
      values.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    ::std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void _process_config_file() {
        if(config_ptr_ != nullptr) {
            bool config_required = config_ptr_->get_required();
            bool file_given = config_ptr_->count() > 0;
            auto config_file = config_ptr_->as<std::string>();
            if(config_file.empty()) {
                if(config_required) {
                    throw FileError::Missing("no specified config file");
                }
                return;
            }

            auto path_result = detail::check_path(config_file.c_str());
            if(path_result == detail::path_type::file) {
                try {
                    std::vector<ConfigItem> values = config_formatter_->from_file(config_file);
                    _parse_config(values);
                    if(!file_given) {
                        config_ptr_->add_result(config_file);
                    }
                } catch(const FileError &) {
                    if(config_required || file_given)
                        throw;
                }
            } else if(config_required || file_given) {
                throw FileError::Missing(config_file);
            }
        }
    }